

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
          (AutoRestoreLoopNumbers *this)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  InterpreterStackFrame *pIVar5;
  InterpreterStackFrame IVar6;
  
  pIVar5 = this->interpreterStackFrame;
  *(undefined8 *)(pIVar5 + 0xcc) = 0xffffffff;
  bVar3 = FunctionBody::RecentlyBailedOutOfJittedLoopBody(*(FunctionBody **)(pIVar5 + 0x88));
  if (bVar3) {
    if (this->doProfileLoopCheck == true) {
      pIVar5 = this->interpreterStackFrame;
      IVar6 = pIVar5[0xd6];
      if (((byte)IVar6 & 0x10) != 0) {
        if (((byte)IVar6 & 8) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x178b,"(!interpreterStackFrame->switchProfileMode)",
                                      "!interpreterStackFrame->switchProfileMode");
          if (!bVar3) goto LAB_0095643a;
          *puVar4 = 0;
          pIVar5 = this->interpreterStackFrame;
          IVar6 = pIVar5[0xd6];
        }
        pIVar5[0xd6] = (InterpreterStackFrame)((byte)IVar6 | 8);
        pIVar5 = this->interpreterStackFrame;
        if (*(int *)(pIVar5 + 0xd8) != -1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x178d,
                                      "(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1)"
                                      ,
                                      "interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1"
                                     );
          if (!bVar3) goto LAB_0095643a;
          *puVar4 = 0;
          pIVar5 = this->interpreterStackFrame;
        }
        *(uint32 *)(pIVar5 + 0xd8) = this->loopNumber;
      }
    }
  }
  else {
    pIVar5 = this->interpreterStackFrame;
    if (*(uint32 *)(pIVar5 + 0xd8) == this->loopNumber) {
      IVar6 = pIVar5[0xd6];
      if (((byte)IVar6 & 8) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1796,"(!interpreterStackFrame->switchProfileMode)",
                                    "!interpreterStackFrame->switchProfileMode");
        if (!bVar3) {
LAB_0095643a:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        pIVar5 = this->interpreterStackFrame;
        IVar6 = pIVar5[0xd6];
      }
      pIVar5[0xd6] = (InterpreterStackFrame)((byte)IVar6 | 8);
      pIVar5 = this->interpreterStackFrame;
      *(undefined4 *)(pIVar5 + 0xd8) = 0xffffffff;
    }
    cVar1 = *(char *)(*(long *)(*(long *)(pIVar5 + 0x78) + 0x3b8) + 0x1658);
    if (cVar1 != '\0') {
      *(char *)(*(long *)(*(long *)(pIVar5 + 0x78) + 0x3b8) + 0x1658) = cVar1 + -1;
    }
  }
  return;
}

Assistant:

~AutoRestoreLoopNumbers()
            {
                interpreterStackFrame->currentLoopNum = LoopHeader::NoLoop;
                interpreterStackFrame->currentLoopCounter = 0;
                Js::FunctionBody* fn = interpreterStackFrame->m_functionBody;
                if (fn->RecentlyBailedOutOfJittedLoopBody())
                {
                    if (doProfileLoopCheck && interpreterStackFrame->isAutoProfiling)
                    {
                        // Start profiling the loop after a bailout. Some bailouts require subsequent profile data collection such
                        // that the rejitted loop body would not bail out again for the same reason.
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        Assert(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1);
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = loopNumber;
                    }
                }
                else
                {
                    if (interpreterStackFrame->switchProfileModeOnLoopEndNumber == loopNumber)
                    {
                        // Stop profiling since the jitted loop body would be exiting the loop
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = 0u - 1;
                    }

                    interpreterStackFrame->scriptContext->GetThreadContext()->DecrementLoopDepth();
                }
            }